

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasJumpType op_mvcle(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  uint val;
  TCGContext_conflict12 *tcg_ctx;
  DisasJumpType DVar2;
  uintptr_t o_2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_i64 local_38;
  TCGTemp *local_30;
  
  uVar1 = (s->fields).presentO;
  if (((uVar1 & 1) != 0) && ((uVar1 & 4) != 0)) {
    uVar1 = (s->fields).c[0];
    val = (s->fields).c[2];
    if (((uVar1 | val) & 1) == 0) {
      tcg_ctx = s->uc->tcg_ctx;
      pTVar3 = tcg_const_i32_s390x(tcg_ctx,uVar1);
      pTVar4 = tcg_const_i32_s390x(tcg_ctx,val);
      local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_38 = o->in2 + (long)tcg_ctx;
      local_40 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
      local_30 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
      tcg_gen_callN_s390x(tcg_ctx,helper_mvcle,(TCGTemp *)(tcg_ctx->cc_op + (long)tcg_ctx),4,
                          &local_48);
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      set_cc_static(s);
      DVar2 = DISAS_NEXT;
    }
    else {
      gen_program_exception(s,6);
      DVar2 = DISAS_NORETURN;
    }
    return DVar2;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_mvcle(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    int r3 = get_field(s, r3);
    TCGv_i32 t1, t3;

    /* r1 and r3 must be even.  */
    if (r1 & 1 || r3 & 1) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    t1 = tcg_const_i32(tcg_ctx, r1);
    t3 = tcg_const_i32(tcg_ctx, r3);
    gen_helper_mvcle(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, t1, o->in2, t3);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t3);
    set_cc_static(s);
    return DISAS_NEXT;
}